

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_columns.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>,_true> __thiscall
duckdb::ColumnHelper::Create(ColumnHelper *this,CatalogEntry *entry)

{
  NotImplementedException *this_00;
  allocator local_39;
  string local_38;
  
  if (entry->type == VIEW_ENTRY) {
    make_uniq<duckdb::ViewColumnHelper,duckdb::ViewCatalogEntry&>
              ((duckdb *)&local_38,(ViewCatalogEntry *)entry);
  }
  else {
    if (entry->type != TABLE_ENTRY) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Unsupported catalog type for duckdb_columns",&local_39);
      NotImplementedException::NotImplementedException(this_00,&local_38);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    make_uniq<duckdb::TableColumnHelper,duckdb::TableCatalogEntry&>
              ((duckdb *)&local_38,(TableCatalogEntry *)entry);
  }
  this->_vptr_ColumnHelper = (_func_int **)local_38._M_dataplus._M_p;
  return (unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>_>)
         (unique_ptr<duckdb::ColumnHelper,_std::default_delete<duckdb::ColumnHelper>_>)this;
}

Assistant:

unique_ptr<ColumnHelper> ColumnHelper::Create(CatalogEntry &entry) {
	switch (entry.type) {
	case CatalogType::TABLE_ENTRY:
		return make_uniq<TableColumnHelper>(entry.Cast<TableCatalogEntry>());
	case CatalogType::VIEW_ENTRY:
		return make_uniq<ViewColumnHelper>(entry.Cast<ViewCatalogEntry>());
	default:
		throw NotImplementedException("Unsupported catalog type for duckdb_columns");
	}
}